

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFPageInput.cpp
# Opt level: O3

PDFRectangle * __thiscall
PDFPageInput::GetCropBox(PDFRectangle *__return_storage_ptr__,PDFPageInput *this)

{
  PDFDictionary *inDictionary;
  EStatusCode EVar1;
  PDFObject *inOriginal;
  PDFArray *inPDFArray;
  PDFPageInput *this_00;
  PDFObjectCastPtr<PDFArray> cropBox;
  undefined1 local_50 [16];
  undefined1 local_40 [24];
  PDFArray *local_28;
  
  PDFRectangle::PDFRectangle(__return_storage_ptr__);
  inDictionary = (this->mPageObject).super_RefCountPtr<PDFDictionary>.mValue;
  local_50._0_8_ = (PDFPageInput *)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CropBox","");
  inOriginal = QueryInheritedValue(this,inDictionary,(string *)local_50);
  inPDFArray = PDFObjectCast<PDFArray>(inOriginal);
  local_40._16_8_ = &PTR__RefCountPtr_003a58d8;
  this_00 = (PDFPageInput *)local_50._0_8_;
  local_28 = inPDFArray;
  if ((PDFPageInput *)local_50._0_8_ != (PDFPageInput *)local_40) {
    operator_delete((void *)local_50._0_8_,(ulong)(local_40._0_8_ + 1));
  }
  EVar1 = SetPDFRectangleFromPDFArray(this_00,inPDFArray,__return_storage_ptr__);
  if (EVar1 != eSuccess) {
    GetMediaBox((PDFRectangle *)local_50,this);
    __return_storage_ptr__->UpperRightX = (double)local_40._0_8_;
    __return_storage_ptr__->UpperRightY = (double)local_40._8_8_;
    __return_storage_ptr__->LowerLeftX = (double)local_50._0_8_;
    __return_storage_ptr__->LowerLeftY = (double)local_50._8_8_;
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_50);
  }
  RefCountPtr<PDFArray>::~RefCountPtr((RefCountPtr<PDFArray> *)(local_40 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

PDFRectangle PDFPageInput::GetCropBox()
{
    PDFRectangle result;
    PDFObjectCastPtr<PDFArray> cropBox(QueryInheritedValue(mPageObject.GetPtr(),"CropBox"));
    
    if(SetPDFRectangleFromPDFArray(cropBox.GetPtr(),result) != eSuccess)
        result = GetMediaBox();
    return result;
}